

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

Promise<void> __thiscall
kj::Promise<void>::attach<kj::String,kj::Array<kj::ArrayPtr<unsigned_char_const>>>
          (Promise<void> *this,String *attachments,
          Array<kj::ArrayPtr<const_unsigned_char>_> *attachments_1)

{
  PromiseBase PVar1;
  String *in_RCX;
  PromiseBase local_60;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_58;
  TupleImpl<kj::_::Indexes<0UL,_1UL>,_kj::String,_kj::Array<kj::ArrayPtr<const_unsigned_char>_>_>
  local_50;
  
  tuple<kj::String,kj::Array<kj::ArrayPtr<unsigned_char_const>>>
            ((ExpandAndApplyResult<kj::_::MakeTupleFunc,_kj::String,_kj::Array<kj::ArrayPtr<const_unsigned_char>_>_>
              *)&local_50,(kj *)attachments_1,in_RCX,
             (Array<kj::ArrayPtr<const_unsigned_char>_> *)in_RCX);
  kj::_::PromiseDisposer::
  appendPromise<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::String,kj::Array<kj::ArrayPtr<unsigned_char_const>>>>,kj::_::PromiseDisposer,kj::_::Tuple<kj::String,kj::Array<kj::ArrayPtr<unsigned_char_const>>>>
            ((PromiseDisposer *)&local_60,(OwnPromiseNode *)attachments,
             (Tuple<kj::String,_kj::Array<kj::ArrayPtr<const_unsigned_char>_>_> *)&local_50);
  PVar1.node.ptr = local_60.node.ptr;
  local_60.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
  (this->super_PromiseBase).node.ptr = (PromiseNode *)PVar1.node.ptr;
  local_58.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_58);
  Own<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::String,_kj::Array<kj::ArrayPtr<const_unsigned_char>_>_>_>,_kj::_::PromiseDisposer>
  ::dispose((Own<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::String,_kj::Array<kj::ArrayPtr<const_unsigned_char>_>_>_>,_kj::_::PromiseDisposer>
             *)&local_60);
  kj::_::
  TupleImpl<kj::_::Indexes<0UL,_1UL>,_kj::String,_kj::Array<kj::ArrayPtr<const_unsigned_char>_>_>::
  ~TupleImpl(&local_50);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<T> Promise<T>::attach(Attachments&&... attachments) {
  return Promise(false,
      _::PromiseDisposer::appendPromise<_::AttachmentPromiseNode<Tuple<Attachments...>>>(
          kj::mv(node), kj::tuple(kj::fwd<Attachments>(attachments)...)));
}